

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

uint argo::utf8::from_hex(char c)

{
  char c_00;
  int iVar1;
  json_utf8_exception *this;
  uint local_c;
  char c_local;
  
  iVar1 = tolower((int)c);
  c_00 = (char)iVar1;
  if ((c_00 < '0') || ('9' < c_00)) {
    if ((c_00 < 'a') || ('f' < c_00)) {
      this = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
      json_utf8_exception::json_utf8_exception(this,invalid_hex_char_e,c_00);
      __cxa_throw(this,&json_utf8_exception::typeinfo,json_utf8_exception::~json_utf8_exception);
    }
    local_c = (int)c_00 - 0x57;
  }
  else {
    local_c = (int)c_00 - 0x30;
  }
  return local_c;
}

Assistant:

unsigned int utf8::from_hex(char c)
{
    c = tolower(c);

    if (c >= '0' && c <= '9')
    {
        return c - '0';
    }
    else if (c >= 'a' && c <= 'f')
    {
        return c - 'a' + 10;
    }
    else
    {
        throw json_utf8_exception(json_utf8_exception::invalid_hex_char_e, c);
    }
}